

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void psllvd_(PDISASM pMyDisasm)

{
  undefined8 uVar1;
  
  if ((pMyDisasm->Prefix).OperandSize != '\x01') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    return;
  }
  (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
  (pMyDisasm->Prefix).OperandSize = '\b';
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    uVar1 = 0x64766c6c737076;
    if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
      if ((pMyDisasm->Reserved_).EVEX.W == '\x01') {
        uVar1 = 0x71766c6c737076;
      }
      *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar1;
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
      ArgsVEX(pMyDisasm);
      return;
    }
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpsllvd",8);
    ArgsVEX(pMyDisasm);
    return;
  }
  (pMyDisasm->Instruction).Category = 0x80000;
  (pMyDisasm->Reserved_).MemDecoration = 0x6d;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"psllvd",7);
  (pMyDisasm->Reserved_).Register_ = 4;
  GxEx(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ psllvd_(PDISASM pMyDisasm)
{
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       if (GV.VEX.state == InUsePrefix) {
         if ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 1)) {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpsllvq");
           #endif
         } else {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpsllvd");
           #endif
         }
         if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
         ArgsVEX(pMyDisasm);
       } else {
         pMyDisasm->Instruction.Category = SSE41_INSTRUCTION;
         GV.MemDecoration = Arg2_m128_xmm;
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "psllvd");
         #endif
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);

       }
   }
   else {
       failDecode(pMyDisasm);
   }
}